

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

bool __thiscall Timidity::SF2Envelope::Update(SF2Envelope *this,Voice *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  
  bVar7 = (this->super_MinEnvelope).stage;
  fVar1 = this->HoldTime;
  dVar8 = exp2((double)fVar1 * 0.0008333333333333334);
  fVar2 = this->AttackTime;
  dVar9 = exp2((double)fVar2 * 0.0008333333333333334);
  bVar5 = 0.0 < dVar9;
  dVar11 = 0.0;
  if (fVar1 != -32768.0) {
    dVar11 = dVar8;
  }
  fVar3 = this->SampleRate;
  fVar4 = this->RateMul;
  if (dVar9 <= 0.006) {
    dVar9 = 0.006;
  }
  fVar12 = this->DelayTime;
  dVar10 = exp2((double)fVar12 * 0.0008333333333333334);
  dVar8 = 0.0;
  if (fVar12 != -32768.0) {
    dVar8 = dVar10;
  }
  iVar6 = this->HoldStart;
  fVar12 = this->volume;
  do {
    switch(bVar7) {
    case 0:
      bVar7 = 1;
      if ((double)v->sample_count < dVar8 * (double)fVar3) {
        return false;
      }
      break;
    case 1:
      if ((fVar2 != -32768.0 && bVar5) &&
         (dVar10 = (double)fVar12 + (double)fVar4 / dVar9, dVar10 < 1.0)) goto LAB_0032b7c6;
      this->volume = 0.0;
      iVar6 = v->sample_count;
      this->HoldStart = iVar6;
      fVar12 = 0.0;
      bVar7 = -32768.0 < fVar1 ^ 3;
      break;
    case 2:
      bVar7 = 3;
      if ((double)(v->sample_count - iVar6) < dVar11 * (double)fVar3) {
        return false;
      }
      break;
    case 3:
      if ((this->DecayTime == -32768.0) ||
         (dVar11 = exp2((double)this->DecayTime * 0.0008333333333333334), dVar11 <= 0.0)) {
        dVar8 = (double)this->SustainLevel;
        dVar10 = dVar8;
      }
      else {
        if (dVar11 <= 0.006) {
          dVar11 = 0.006;
        }
        dVar8 = (double)this->SustainLevel;
        dVar10 = (double)this->RateMul_cB / dVar11 + (double)fVar12;
      }
      if (dVar8 <= dVar10) {
        (this->super_MinEnvelope).stage = '\x04';
        (this->super_MinEnvelope).bUpdating = '\0';
        dVar10 = dVar8;
        if ((v->status & 4) == 0) {
          v->status = v->status | 2;
        }
      }
LAB_0032b7c6:
      this->volume = (float)dVar10;
    case 4:
      return false;
    case 5:
      if ((this->ReleaseTime != -32768.0) &&
         (dVar11 = exp2((double)this->ReleaseTime * 0.0008333333333333334), 0.0 < dVar11)) {
        if (dVar11 <= 0.006) {
          dVar11 = 0.006;
        }
        dVar10 = (double)this->RateMul_cB / dVar11 + (double)fVar12;
        if (dVar10 < 960.0) goto LAB_0032b7c6;
      }
      (this->super_MinEnvelope).stage = '\x06';
      v->status = v->status & 0xe1 | 0xc;
      (this->super_MinEnvelope).bUpdating = '\0';
      return true;
    case 6:
      return true;
    default:
      dVar10 = 0.0;
      goto LAB_0032b7c6;
    }
    (this->super_MinEnvelope).stage = bVar7;
  } while( true );
}

Assistant:

bool SF2Envelope::Update(Voice *v)
{
	double sec;
	double newvolume = 0;

	// NOTE! The volume scale is different for different stages of the
	// envelope generator:
	// Attack stage goes from 0.0 -> 1.0, multiplied directly to the output.
	// The following stages go from 0 -> -1000 cB (but recorded positively)
	switch (stage)
	{
	case SF2_DELAY:
		if (v->sample_count >= timecent_to_sec(DelayTime) * SampleRate)
		{
			stage = SF2_ATTACK;
			return Update(v);
		}
		return 0;

	case SF2_ATTACK:
		sec = timecent_to_sec(AttackTime);
		if (sec <= 0)
		{ // instantaneous attack
			newvolume = 1;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul, sec);
		}
		if (newvolume >= 1)
		{
			volume = 0;
			HoldStart = v->sample_count;
			if (HoldTime <= -32768)
			{ // hold time is 0, so skip right to decay
				stage = SF2_DECAY;
			}
			else
			{
				stage = SF2_HOLD;
			}
			return Update(v);
		}
		break;

	case SF2_HOLD:
		if (v->sample_count - HoldStart >= timecent_to_sec(HoldTime) * SampleRate)
		{
			stage = SF2_DECAY;
			return Update(v);
		}
		return 0;

	case SF2_DECAY:
		sec = timecent_to_sec(DecayTime);
		if (sec <= 0)
		{ // instantaneous decay
			newvolume = SustainLevel;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= SustainLevel)
		{
			newvolume = SustainLevel;
			stage = SF2_SUSTAIN;
			bUpdating = false;
			if (!(v->status & VOICE_RELEASING))
			{
				v->status |= VOICE_SUSTAINING;
			}
		}
		break;

	case SF2_SUSTAIN:
		// Stay here until released.
		return 0;

	case SF2_RELEASE:
		sec = timecent_to_sec(ReleaseTime);
		if (sec <= 0)
		{ // instantaneous release
			newvolume = 1000;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= 960)
		{
			stage = SF2_FINISHED;
			shutoff_voice(v);
			bUpdating = false;
			return 1;
		}
		break;

	case SF2_FINISHED:
		return 1;
	}
	volume = (float)newvolume;
	return 0;
}